

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void ravi_dump_stack(lua_State *L,char *s)

{
  CallInfo *local_20;
  CallInfo *ci;
  char *s_local;
  lua_State *L_local;
  
  if (s != (char *)0x0) {
    local_20 = L->ci;
    printf("=======================\n");
    printf("Stack dump %s\n",s);
    printf("=======================\n");
    printf("L->top = %d\n",(long)L->top - (long)L->stack >> 4 & 0xffffffff);
    for (; local_20 != (CallInfo *)0x0; local_20 = local_20->previous) {
      ravi_dump_ci(L,local_20);
    }
    printf(anon_var_dwarf_b51f + 5);
  }
  return;
}

Assistant:

void ravi_dump_stack(lua_State *L, const char *s) {
  if (!s)
    return;
  CallInfo *ci = L->ci;
  printf("=======================\n");
  printf("Stack dump %s\n", s);
  printf("=======================\n");
  printf("L->top = %d\n", (int)(L->top - L->stack));
  while (ci) {
    ravi_dump_ci(L, ci);
    ci = ci->previous;
  }
  printf("\n");
}